

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table-utils.cpp
# Opt level: O3

bool wasm::TableUtils::usesExpressions(ElementSegment *curr,Module *module)

{
  pointer ppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  long lVar5;
  ulong uVar6;
  
  ppEVar3 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar1 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)ppEVar1 - (long)ppEVar3;
  if (0 < (long)uVar6 >> 5) {
    ppEVar2 = (pointer)((uVar6 & 0xffffffffffffffe0) + (long)ppEVar3);
    lVar5 = ((long)uVar6 >> 5) + 1;
    ppEVar4 = ppEVar3 + 2;
    do {
      if (ppEVar4[-2]->_id != RefFuncId) {
        ppEVar4 = ppEVar4 + -2;
        goto LAB_00730548;
      }
      if (ppEVar4[-1]->_id != RefFuncId) {
        ppEVar4 = ppEVar4 + -1;
        goto LAB_00730548;
      }
      if ((*ppEVar4)->_id != RefFuncId) goto LAB_00730548;
      if (ppEVar4[1]->_id != RefFuncId) {
        ppEVar4 = ppEVar4 + 1;
        goto LAB_00730548;
      }
      lVar5 = lVar5 + -1;
      ppEVar4 = ppEVar4 + 4;
    } while (1 < lVar5);
    uVar6 = (long)ppEVar1 - (long)ppEVar2;
    ppEVar3 = ppEVar2;
  }
  lVar5 = (long)uVar6 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppEVar4 = ppEVar1;
      if ((lVar5 != 3) || (ppEVar4 = ppEVar3, (*ppEVar3)->_id != RefFuncId)) goto LAB_00730548;
      ppEVar3 = ppEVar3 + 1;
    }
    ppEVar4 = ppEVar3;
    if ((*ppEVar3)->_id != RefFuncId) goto LAB_00730548;
    ppEVar3 = ppEVar3 + 1;
  }
  ppEVar4 = ppEVar3;
  if ((*ppEVar3)->_id == RefFuncId) {
    ppEVar4 = ppEVar1;
  }
LAB_00730548:
  return (curr->type).id != 0x12 || ppEVar4 != ppEVar1;
}

Assistant:

bool usesExpressions(ElementSegment* curr, Module* module) {
  // Binaryen IR always has ref.funcs for functions in tables for uniformity,
  // so that by itself does not indicate if expressions should be used when
  // emitting the table or not. But definitely anything that is not a ref.func
  // implies we are post-MVP and must use expressions.
  bool allElementsRefFunc =
    std::all_of(curr->data.begin(), curr->data.end(), [](Expression* entry) {
      return entry->is<RefFunc>();
    });

  // If the segment has a specialized (non-MVP) type, then it must use the
  // post-MVP form of using expressions.
  bool hasSpecializedType = curr->type != Type(HeapType::func, Nullable);

  return !allElementsRefFunc || hasSpecializedType;
}